

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

pos sel_spread_half(Terminal *term,pos p,wchar_t dir)

{
  anon_enum_32 aVar1;
  termchar *ptVar2;
  short sVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  termline *ptVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  wchar_t y;
  termchar *ptVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  pos local_50;
  termline *local_40;
  
  wVar4 = sblines(term);
  uVar9 = 0;
  local_40 = lineptr(term,p.y,L'᪜',L'\0');
  aVar1 = term->selmode;
  if (aVar1 == DRAGGING) {
    if (dir != L'\xffffffff') {
      uVar9 = (ulong)(uint)(term->cols + L'\xffffffff');
    }
  }
  else {
    uVar9 = (ulong)p >> 0x20;
    uVar8 = (long)p >> 0x20;
    if (aVar1 == ABOUT_TO) {
      if ((p.x != L'\0' && -1 < (long)p) && (local_40->chars[uVar9].chr == 0xdfff)) {
        uVar8 = (ulong)(uint)(p.x + L'\xffffffff');
      }
      wVar5 = wordtype(term,(wchar_t)local_40->chars[uVar8].chr);
      sVar3 = (short)wVar5;
      local_50 = p;
      if (dir == L'\x01') {
        ptVar6 = local_40;
        while( true ) {
          local_40 = ptVar6;
          uVar7 = *(uint *)local_40;
          wVar4 = term->cols + L'\xfffffffd';
          if (local_40->trusted == false) {
            wVar4 = term->cols;
          }
          iVar16 = ((int)(short)(uVar7 << 10) >> 0xf) + wVar4;
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          uVar8 = uVar9;
          while (uVar9 = uVar8, iVar14 = (int)uVar9, p = local_50, iVar14 < iVar16 + -1) {
            uVar15 = iVar14 + 1;
            if ((iVar14 < 0) || (uVar8 = uVar9, local_40->chars[uVar15].chr != 0xdfff)) {
              uVar8 = (long)(int)uVar15;
            }
            wVar4 = wordtype(term,(wchar_t)local_40->chars[uVar8].chr);
            uVar8 = (ulong)uVar15;
            if (wVar4 != sVar3) goto LAB_00112794;
          }
          if (((uVar7 & 0x10) == 0) || (wVar4 = local_50.y + L'\x01', term->rows <= wVar4))
          goto LAB_00112794;
          ptVar6 = lineptr(term,wVar4,L'᫁',L'\0');
          ptVar11 = ptVar6->chars;
          wVar5 = wordtype(term,(wchar_t)ptVar11->chr);
          if (wVar5 != sVar3) break;
          uVar9 = 0;
          local_50.x = L'\0';
          local_50.y = wVar4;
          if (local_40->temporary == true) {
            safefree(local_40->chars);
            safefree(local_40);
            local_50.x = L'\0';
          }
        }
        if (ptVar6->temporary == true) {
          safefree(ptVar11);
          safefree(ptVar6);
        }
      }
      else {
        ptVar6 = local_40;
        uVar8 = uVar9;
LAB_0011261e:
        local_40 = ptVar6;
        lVar13 = uVar8 * 0x20 + -0x40;
        uVar7 = (uint)uVar8;
        while( true ) {
          uVar15 = uVar7 - 1;
          uVar9 = (ulong)uVar7;
          p = local_50;
          if ((int)uVar7 < 1) break;
          if (uVar15 == 0) {
            uVar8 = 0;
LAB_00112661:
            lVar12 = uVar8 << 5;
          }
          else {
            uVar8 = (ulong)uVar15;
            lVar12 = lVar13;
            if (local_40->chars[uVar8].chr != 0xdfff) goto LAB_00112661;
          }
          wVar5 = wordtype(term,*(wchar_t *)((long)&local_40->chars->chr + lVar12));
          lVar13 = lVar13 + -0x20;
          uVar7 = uVar15;
          if (wVar5 != sVar3) goto LAB_00112794;
        }
        if (local_50.y <= -wVar4) goto LAB_00112794;
        y = local_50.y + L'\xffffffff';
        ptVar6 = lineptr(term,y,L'᫜',L'\0');
        wVar5 = term->cols + L'\xfffffffd';
        if (ptVar6->trusted == false) {
          wVar5 = term->cols;
        }
        uVar15 = ((int)(short)(ptVar6->lattr << 10) >> 0xf) + wVar5;
        uVar7 = 0;
        if (0 < (int)uVar15) {
          uVar7 = uVar15;
        }
        if ((ptVar6->lattr & 0x10) == 0) goto LAB_00112794;
        uVar8 = (ulong)(uVar7 - 1);
        ptVar11 = ptVar6->chars;
        if (((int)uVar15 < 2) || (ptVar11[uVar8].chr != 0xdfff)) {
          lVar13 = (long)(int)(uVar7 - 1);
        }
        else {
          lVar13 = (ulong)uVar7 - 2;
        }
        wVar5 = wordtype(term,(wchar_t)ptVar11[lVar13].chr);
        if (wVar5 == sVar3) {
          local_50.x = L'\0';
          local_50.y = y;
          if (local_40->temporary != false) {
            safefree(local_40->chars);
            safefree(local_40);
            local_50.x = L'\0';
          }
          goto LAB_0011261e;
        }
        if (ptVar6->temporary == true) {
          safefree(ptVar11);
          safefree(ptVar6);
        }
      }
    }
    else if ((aVar1 == LEXICOGRAPHIC) && ((local_40->lattr & 0x10) == 0)) {
      wVar4 = term->cols;
      wVar5 = wVar4 + L'\xfffffffd';
      if (local_40->trusted == false) {
        wVar5 = wVar4;
      }
      uVar7 = ((int)(short)(local_40->lattr << 10) >> 0xf) + wVar5;
      uVar10 = 0;
      if (0 < (int)uVar7) {
        uVar10 = (ulong)uVar7;
      }
      ptVar11 = local_40->chars + uVar10;
      lVar13 = uVar10 * -0x20;
      do {
        lVar12 = lVar13;
        if ((ptVar11 <= local_40->chars) ||
           (ptVar11[-1].chr != 0x20 && ((uint)ptVar11[-1].chr & 0xfffffcff) != 0xd820)) break;
        ptVar2 = ptVar11 + -1;
        ptVar11 = ptVar11 + -1;
        lVar13 = lVar12 + 0x20;
      } while (ptVar2->cc_next == L'\0');
      uVar10 = (long)(((ulong)((long)wVar4 * 0x20 + lVar12 != 0) * 0x20 - lVar12) + -0x20) >> 5;
      if (((long)uVar10 <= (long)uVar8) && (uVar9 = uVar10, dir != L'\xffffffff')) {
        uVar9 = (ulong)(uint)(wVar4 + L'\xffffffff');
      }
    }
  }
LAB_00112794:
  if (local_40->temporary == true) {
    safefree(local_40->chars);
    safefree(local_40);
  }
  return (pos)((ulong)p & 0xffffffff | uVar9 << 0x20);
}

Assistant:

static pos sel_spread_half(Terminal *term, pos p, int dir)
{
    termline *ldata;
    short wvalue;
    int topy = -sblines(term);

    ldata = lineptr(p.y);

    switch (term->selmode) {
      case SM_CHAR:
        /*
         * In this mode, every character is a separate unit, except
         * for runs of spaces at the end of a non-wrapping line.
         */
        if (!(ldata->lattr & LATTR_WRAPPED)) {
            termchar *q = ldata->chars + line_cols(term, ldata);
            while (q > ldata->chars &&
                   IS_SPACE_CHR(q[-1].chr) && !q[-1].cc_next)
                q--;
            if (q == ldata->chars + term->cols)
                q--;
            if (p.x >= q - ldata->chars)
                p.x = (dir == -1 ? q - ldata->chars : term->cols - 1);
        }
        break;
      case SM_WORD:
        /*
         * In this mode, the units are maximal runs of characters
         * whose `wordness' has the same value.
         */
        wvalue = wordtype(term, UCSGET(ldata->chars, p.x));
        if (dir == +1) {
            while (1) {
                int maxcols = line_cols(term, ldata);
                if (p.x < maxcols-1) {
                    if (wordtype(term, UCSGET(ldata->chars, p.x+1)) == wvalue)
                        p.x++;
                    else
                        break;
                } else {
                    if (p.y+1 < term->rows &&
                        (ldata->lattr & LATTR_WRAPPED)) {
                        termline *ldata2;
                        ldata2 = lineptr(p.y+1);
                        if (wordtype(term, UCSGET(ldata2->chars, 0))
                            == wvalue) {
                            p.x = 0;
                            p.y++;
                            unlineptr(ldata);
                            ldata = ldata2;
                        } else {
                            unlineptr(ldata2);
                            break;
                        }
                    } else
                        break;
                }
            }
        } else {
            while (1) {
                if (p.x > 0) {
                    if (wordtype(term, UCSGET(ldata->chars, p.x-1)) == wvalue)
                        p.x--;
                    else
                        break;
                } else {
                    termline *ldata2;
                    int maxcols;
                    if (p.y <= topy)
                        break;
                    ldata2 = lineptr(p.y-1);
                    maxcols = line_cols(term, ldata2);
                    if (ldata2->lattr & LATTR_WRAPPED) {
                        if (wordtype(term, UCSGET(ldata2->chars, maxcols-1))
                            == wvalue) {
                            p.x = maxcols-1;
                            p.y--;
                            unlineptr(ldata);
                            ldata = ldata2;
                        } else {
                            unlineptr(ldata2);
                            break;
                        }
                    } else
                        break;
                }
            }
        }
        break;
      case SM_LINE:
        /*
         * In this mode, every line is a unit.
         */
        p.x = (dir == -1 ? 0 : term->cols - 1);
        break;
    }

    unlineptr(ldata);
    return p;
}